

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O0

void set_port_option<boost::asio::serial_port_base::character_size>
               (serial_port *port,character_size *option,string *device_name,string *name)

{
  bool bVar1;
  runtime_error *this;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  error_code local_48;
  undefined1 local_38 [8];
  error_code ec;
  string *name_local;
  string *device_name_local;
  character_size *option_local;
  serial_port *port_local;
  
  ec.cat_ = (error_category *)name;
  boost::system::error_code::error_code((error_code *)local_38);
  local_48 = boost::asio::
             basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ::set_option<boost::asio::serial_port_base::character_size>
                       (&port->port,option,(error_code *)local_38);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_38);
  if (!bVar1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_e8,"error setting \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ec.cat_);
  std::operator+(&local_c8,&local_e8,"\" on \"");
  std::operator+(&local_a8,&local_c8,device_name);
  std::operator+(&local_88,&local_a8,"\": ");
  boost::system::error_code::message_abi_cxx11_(&local_118,(error_code *)local_38);
  std::operator+(&local_68,&local_88,&local_118);
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_port_option( serial_port& port, const O& option,
    const std::string& device_name, const std::string& name )
{
    boost::system::error_code ec;
    port.port.set_option( option, ec );

    if ( ec )
        throw std::runtime_error( "error setting \"" + name + "\" on \"" + device_name + "\": " + ec.message() );
}